

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O1

VarSet * __thiscall libDAI::VarSet::operator|=(VarSet *this,Var *n)

{
  Var *pVVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  const_iterator __position;
  ulong uVar4;
  
  __position._M_current =
       (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVVar1 = (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)pVVar1 - (long)__position._M_current >> 4;
  if (0 < (long)uVar4) {
    do {
      uVar2 = uVar4 >> 1;
      uVar3 = uVar2;
      if (__position._M_current[uVar2]._label < n->_label) {
        uVar3 = ~uVar2 + uVar4;
        __position._M_current = __position._M_current + uVar2 + 1;
      }
      uVar4 = uVar3;
    } while (0 < (long)uVar3);
  }
  if ((__position._M_current == pVVar1) || ((__position._M_current)->_label != n->_label)) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::insert(&this->_vars,__position,n);
    this->_statespace = this->_statespace * n->_states;
  }
  return this;
}

Assistant:

VarSet& operator|= ( const Var& n ) {
                std::vector<Var>::iterator pos = lower_bound( _vars.begin(), _vars.end(), n );
                if( pos == _vars.end() || *pos != n ) { // insert it
                    _vars.insert( pos, n );
                    _statespace *= n.states();
                }
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
                return *this;
            }